

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

void av1_compute_gm_for_valid_ref_frames
               (AV1_COMP *cpi,aom_internal_error_info *error_info,YV12_BUFFER_CONFIG **ref_buf,
               int frame,MotionModel *motion_models,uint8_t *segment_map,int segment_map_w,
               int segment_map_h)

{
  WarpedMotionParams *ref_params;
  AV1_COMMON *cm;
  uint8_t *in_stack_00000088;
  MotionModel *in_stack_00000090;
  int in_stack_0000009c;
  YV12_BUFFER_CONFIG **in_stack_000000a0;
  aom_internal_error_info *in_stack_000000a8;
  AV1_COMP *in_stack_000000b0;
  int in_stack_000000f0;
  int in_stack_000000f8;
  WarpedMotionParams *in_stack_00000100;
  
  compute_global_motion_for_ref_frame
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,
             in_stack_00000090,in_stack_00000088,in_stack_000000f0,in_stack_000000f8,
             in_stack_00000100);
  return;
}

Assistant:

void av1_compute_gm_for_valid_ref_frames(
    AV1_COMP *cpi, struct aom_internal_error_info *error_info,
    YV12_BUFFER_CONFIG *ref_buf[REF_FRAMES], int frame,
    MotionModel *motion_models, uint8_t *segment_map, int segment_map_w,
    int segment_map_h) {
  AV1_COMMON *const cm = &cpi->common;
  const WarpedMotionParams *ref_params =
      cm->prev_frame ? &cm->prev_frame->global_motion[frame]
                     : &default_warp_params;

  compute_global_motion_for_ref_frame(cpi, error_info, ref_buf, frame,
                                      motion_models, segment_map, segment_map_w,
                                      segment_map_h, ref_params);
}